

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_octdec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxu32 local_3c;
  jx9_int64 jStack_38;
  int nLen;
  jx9_int64 iVal;
  char *zString;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zString = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_int(pCtx,-1);
  }
  else {
    jStack_38 = 0;
    iVar1 = jx9_value_is_string(*apArg);
    if (iVar1 == 0) {
      jStack_38 = jx9_value_to_int64(*(jx9_value **)zString);
    }
    else {
      iVal = (jx9_int64)jx9_value_to_string(*(jx9_value **)zString,(int *)&local_3c);
      if (0 < (int)local_3c) {
        SyOctalStrToInt64((char *)iVal,local_3c,&stack0xffffffffffffffc8,(char **)0x0);
      }
    }
    jx9_result_int64(pjStack_18,jStack_38);
  }
  return 0;
}

Assistant:

static int jx9Builtin_octdec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		if( nLen > 0 ){
			/* Perform the cast */
			SyOctalStrToInt64(zString, (sxu32)nLen, (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}